

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::MethodOptions::_InternalParse(MethodOptions *this,char *ptr,ParseContext *ctx)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  byte *pbVar5;
  Rep *pRVar6;
  UninterpretedOption *msg;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  uint32 uVar10;
  uint tag;
  uint uVar11;
  int iVar12;
  UnknownFieldSet *this_01;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  pair<const_char_*,_bool> pVar15;
  
  this_00 = &this->_internal_metadata_;
  uVar11 = 0;
LAB_001748e6:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00174b7f;
      pVar15 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar15.first;
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00174b7f;
    }
    bVar1 = *ptr;
    pVar13.second._0_1_ = bVar1;
    pVar13.first = (char *)((byte *)ptr + 1);
    pVar13._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar10 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar13 = internal::ReadTagFallback(ptr,uVar10);
        if (pVar13.first == (char *)0x0) goto LAB_00174b92;
      }
      else {
        pVar13.second = uVar10;
        pVar13.first = (char *)((byte *)ptr + 2);
        pVar13._12_4_ = 0;
      }
    }
    ptr = pVar13.first;
    tag = pVar13.second;
    uVar7 = (uint)(pVar13._8_8_ >> 3) & 0x1fffffff;
    cVar9 = (char)pVar13.second;
    if (uVar7 == 999) {
      if (cVar9 == ':') {
        ptr = (char *)((byte *)ptr + -2);
        do {
          pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar12 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_001749ee:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar12 + 1);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = pRVar6->allocated_size;
LAB_001749fe:
            pRVar6->allocated_size = iVar12 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
            pRVar6->elements[iVar12] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar12 = pRVar6->allocated_size;
            if (iVar12 <= iVar3) {
              if (iVar12 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_001749ee;
              goto LAB_001749fe;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar6->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          if ((byte *)ptr == (byte *)0x0) goto LAB_00174b92;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
        goto LAB_001748e6;
      }
LAB_00174a78:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        goto LAB_00174b7f;
      }
      if (tag < 8000) {
        ptr = internal::UnknownFieldParse(tag,this_00,ptr,ctx);
      }
      else {
        ptr = internal::ExtensionSet::ParseField
                        (&this->_extensions_,pVar13._8_8_ & 0xffffffff,ptr,
                         (Message *)_MethodOptions_default_instance_,this_00,ctx);
      }
    }
    else {
      if (uVar7 == 0x22) {
        if (cVar9 != '\x10') goto LAB_00174a78;
        bVar1 = *ptr;
        pVar14.second = (long)(char)bVar1;
        pVar14.first = (char *)((byte *)ptr + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = ((byte *)ptr)[1];
          uVar10 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar14 = internal::VarintParseSlow64(ptr,uVar10);
            if (pVar14.first == (char *)0x0) goto LAB_00174b92;
          }
          else {
            pVar14.second._0_4_ = uVar10;
            pVar14.first = (char *)((byte *)ptr + 2);
            pVar14.second._4_4_ = 0;
          }
        }
        ptr = pVar14.first;
        if ((uint)pVar14.second < 3) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          this->idempotency_level_ = (uint)pVar14.second;
        }
        else {
          pvVar4 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar4 & 1) == 0) {
            this_01 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            this_01 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
          }
          UnknownFieldSet::AddVarint(this_01,0x22,pVar14.second);
        }
        goto LAB_001748e6;
      }
      if ((uVar7 != 0x21) || (cVar9 != '\b')) goto LAB_00174a78;
      uVar8 = (ulong)*ptr;
      pbVar5 = (byte *)ptr + 1;
      if (-1 < (long)uVar8) {
LAB_0017497f:
        this->deprecated_ = uVar8 != 0;
        uVar11 = 1;
        ptr = (char *)pbVar5;
        goto LAB_001748e6;
      }
      uVar11 = ((uint)*pbVar5 * 0x80 + (uint)(byte)*ptr) - 0x80;
      if (-1 < (char)*pbVar5) {
        uVar8 = (ulong)uVar11;
        pbVar5 = (byte *)ptr + 2;
        goto LAB_0017497f;
      }
      pVar14 = internal::VarintParseSlow64(ptr,uVar11);
      ptr = pVar14.first;
      this->deprecated_ = pVar14.second != 0;
      uVar11 = 1;
    }
    if ((byte *)ptr == (byte *)0x0) {
LAB_00174b92:
      ptr = (char *)0x0;
LAB_00174b7f:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar11;
      return ptr;
    }
  } while( true );
}

Assistant:

const char* MethodOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
      case 34:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel_IsValid(val))) {
            _internal_set_idempotency_level(static_cast<PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(34, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}